

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  undefined8 *puVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int *piVar17;
  double **ppdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  
  for (uVar32 = 0; uVar32 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar32 = uVar32 + 1
      ) {
    piVar17 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
    iVar12 = piVar17[partitionIndices[uVar32]];
    iVar13 = piVar17[(long)partitionIndices[uVar32] + 1];
    iVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kStateCount;
    memset((this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp + iVar14 * iVar12,0,
           (long)((iVar13 - iVar12) * iVar14) << 3);
    iVar14 = childBufferIndices[uVar32];
    ppdVar18 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials;
    pdVar19 = ppdVar18[parentBufferIndices[uVar32]];
    pdVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights
              [categoryWeightsIndices[uVar32]];
    pdVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).gTransitionMatrices
              [probabilityIndices[uVar32]];
    if ((iVar14 < (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount) &&
       (piVar17 = (this->super_BeagleCPUImpl<double,_1,_0>).gTipStates[iVar14],
       piVar17 != (int *)0x0)) {
      uVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      iVar31 = 0;
      iVar27 = iVar12 * 4;
      iVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
      iVar28 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
      iVar24 = iVar27;
      for (uVar30 = 0; uVar30 != (~((int)uVar15 >> 0x1f) & uVar15); uVar30 = uVar30 + 1) {
        auVar40._8_8_ = 0;
        auVar40._0_8_ = pdVar20[uVar30];
        pdVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        lVar25 = 0;
        lVar29 = (long)iVar12;
        while (lVar29 < iVar13) {
          iVar16 = *(int *)((long)piVar17 + lVar25 + (long)iVar12 * 4);
          lVar29 = lVar29 + 1;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar22[iVar27 + lVar25];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = pdVar21[iVar16 + iVar31] * pdVar19[iVar24 + lVar25];
          auVar41 = vfmadd213sd_fma(auVar42,auVar40,auVar7);
          pdVar22[iVar27 + lVar25] = auVar41._0_8_;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = pdVar22[(long)iVar27 + lVar25 + 1];
          auVar43._8_8_ = 0;
          auVar43._0_8_ = pdVar21[iVar31 + 5 + iVar16] * pdVar19[(long)iVar24 + lVar25 + 1];
          auVar41 = vfmadd213sd_fma(auVar43,auVar40,auVar8);
          pdVar22[(long)iVar27 + lVar25 + 1] = auVar41._0_8_;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pdVar22[(long)iVar27 + lVar25 + 2];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = pdVar21[iVar31 + 10 + iVar16] * pdVar19[(long)iVar24 + lVar25 + 2];
          auVar41 = vfmadd213sd_fma(auVar44,auVar40,auVar9);
          pdVar22[(long)iVar27 + lVar25 + 2] = auVar41._0_8_;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = pdVar22[(long)iVar27 + lVar25 + 3];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = pdVar21[iVar16 + iVar31 + 0xf] * pdVar19[(long)iVar24 + lVar25 + 3];
          auVar41 = vfmadd213sd_fma(auVar45,auVar40,auVar10);
          pdVar22[(long)iVar27 + lVar25 + 3] = auVar41._0_8_;
          lVar25 = lVar25 + 4;
        }
        iVar31 = iVar31 + 0x14;
        iVar24 = (int)lVar25 + iVar24 + ((iVar12 - iVar13) + iVar14 + iVar28) * 4;
      }
    }
    else {
      pdVar22 = ppdVar18[iVar14];
      uVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      iVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
      lVar29 = 0;
      iVar24 = iVar12 * 4;
      iVar28 = iVar24;
      for (uVar30 = 0; uVar30 != (~((int)uVar15 >> 0x1f) & uVar15); uVar30 = uVar30 + 1) {
        lVar26 = (long)iVar28;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = pdVar21[lVar29];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = pdVar21[lVar29 + 1];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = pdVar21[lVar29 + 2];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = pdVar21[lVar29 + 3];
        auVar50._8_8_ = 0;
        auVar50._0_8_ = pdVar21[lVar29 + 5];
        auVar51._8_8_ = 0;
        auVar51._0_8_ = pdVar21[lVar29 + 6];
        auVar52._8_8_ = 0;
        auVar52._0_8_ = pdVar21[lVar29 + 7];
        auVar53._8_8_ = 0;
        auVar53._0_8_ = pdVar21[lVar29 + 8];
        auVar54._8_8_ = 0;
        auVar54._0_8_ = pdVar21[lVar29 + 10];
        auVar55._8_8_ = 0;
        auVar55._0_8_ = pdVar21[lVar29 + 0xb];
        auVar56._8_8_ = 0;
        auVar56._0_8_ = pdVar21[lVar29 + 0xc];
        auVar57._8_8_ = 0;
        auVar57._0_8_ = pdVar21[lVar29 + 0xd];
        auVar58._8_8_ = 0;
        auVar58._0_8_ = pdVar21[lVar29 + 0xf];
        auVar59._8_8_ = 0;
        auVar59._0_8_ = pdVar21[lVar29 + 0x10];
        auVar60._8_8_ = 0;
        auVar60._0_8_ = pdVar21[lVar29 + 0x11];
        dVar2 = pdVar21[lVar29 + 0x12];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = pdVar20[uVar30];
        pdVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        lVar25 = 0x18;
        iVar27 = iVar12;
        while (iVar27 < iVar13) {
          uVar3 = *(ulong *)((long)pdVar22 + lVar25 + lVar26 * 8 + -0x10);
          uVar4 = *(ulong *)((long)pdVar22 + lVar25 + lVar26 * 8 + -0x18);
          uVar5 = *(ulong *)((long)pdVar22 + lVar25 + lVar26 * 8 + -8);
          uVar6 = *(ulong *)((long)pdVar22 + lVar25 + lVar26 * 8);
          iVar27 = iVar27 + 1;
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar3;
          auVar33 = vmulsd_avx512f(auVar47,auVar64);
          auVar34 = vmulsd_avx512f(auVar51,auVar64);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar3;
          auVar35 = vmulsd_avx512f(auVar55,auVar65);
          auVar36 = vmulsd_avx512f(auVar59,auVar65);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar4;
          auVar33 = vfmadd231sd_avx512f(auVar33,auVar46,auVar62);
          auVar34 = vfmadd231sd_avx512f(auVar34,auVar50,auVar62);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar4;
          auVar35 = vfmadd231sd_avx512f(auVar35,auVar54,auVar63);
          auVar36 = vfmadd231sd_avx512f(auVar36,auVar58,auVar63);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar5;
          auVar33 = vfmadd231sd_avx512f(auVar33,auVar48,auVar66);
          auVar34 = vfmadd231sd_avx512f(auVar34,auVar52,auVar66);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar5;
          auVar35 = vfmadd231sd_avx512f(auVar35,auVar56,auVar67);
          auVar36 = vfmadd231sd_avx512f(auVar36,auVar60,auVar67);
          auVar68._8_8_ = 0;
          auVar68._0_8_ = uVar6;
          auVar37 = vfmadd231sd_avx512f(auVar33,auVar49,auVar68);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)((long)pdVar19 + lVar25 + lVar26 * 8 + -0x18);
          auVar33 = vmulsd_avx512f(auVar37,auVar33);
          auVar37 = vfmadd231sd_avx512f(auVar34,auVar53,auVar68);
          auVar69._8_8_ = 0;
          auVar69._0_8_ = uVar6;
          auVar38 = vfmadd231sd_avx512f(auVar35,auVar57,auVar69);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = dVar2;
          auVar39 = vfmadd231sd_avx512f(auVar36,auVar61,auVar69);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)((long)pdVar23 + lVar25 + (long)iVar24 * 8 + -0x18);
          auVar33 = vfmadd213sd_avx512f(auVar33,auVar41,auVar34);
          puVar1 = (undefined8 *)((long)pdVar23 + lVar25 + (long)iVar24 * 8 + -0x18);
          vmovsd_avx512f(auVar33);
          *puVar1 = *puVar1;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)((long)pdVar19 + lVar25 + lVar26 * 8 + -0x10);
          auVar33 = vmulsd_avx512f(auVar37,auVar35);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)((long)pdVar23 + lVar25 + (long)iVar24 * 8 + -0x10);
          auVar33 = vfmadd213sd_avx512f(auVar33,auVar41,auVar36);
          puVar1 = (undefined8 *)((long)pdVar23 + lVar25 + (long)iVar24 * 8 + -0x10);
          vmovsd_avx512f(auVar33);
          *puVar1 = *puVar1;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)((long)pdVar19 + lVar25 + lVar26 * 8 + -8);
          auVar33 = vmulsd_avx512f(auVar38,auVar37);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)((long)pdVar23 + lVar25 + (long)iVar24 * 8 + -8);
          auVar33 = vfmadd213sd_avx512f(auVar33,auVar41,auVar38);
          puVar1 = (undefined8 *)((long)pdVar23 + lVar25 + (long)iVar24 * 8 + -8);
          vmovsd_avx512f(auVar33);
          *puVar1 = *puVar1;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)((long)pdVar19 + lVar25 + lVar26 * 8);
          auVar33 = vmulsd_avx512f(auVar39,auVar11);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)pdVar23 + lVar25 + (long)iVar24 * 8);
          auVar33 = vfmadd213sd_avx512f(auVar33,auVar41,auVar39);
          puVar1 = (undefined8 *)((long)pdVar23 + lVar25 + (long)iVar24 * 8);
          vmovsd_avx512f(auVar33);
          *puVar1 = *puVar1;
          lVar25 = lVar25 + 0x20;
        }
        lVar29 = lVar29 + 0x14;
        iVar28 = iVar28 + iVar14 * 4;
      }
    }
  }
  integrateOutStatesAndScaleByPartition
            (this,(this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp,stateFrequenciesIndices,
             cumulativeScaleIndices,partitionIndices,partitionCount,outSumLogLikelihoodByPartition);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition(
                                                          const int* parentBufferIndices,
                                                          const int* childBufferIndices,
                                                          const int* probabilityIndices,
                                                          const int* categoryWeightsIndices,
                                                          const int* stateFrequenciesIndices,
                                                          const int* cumulativeScaleIndices,
                                                          const int* partitionIndices,
                                                          int partitionCount,
                                                          double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * 4; // Index for parent partials
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];

                    integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
            }
        } else { // Integrate against a partial at the child
            const REALTYPE* partialsChild = gPartials[childIndex];
        #if 0//
            int v = 0;
        #endif
            int w = 0;
            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * 4;
          #if 1//
          int v = l*kPaddedPatternCount*4 + startPattern * 4;
          #endif
                const REALTYPE weight = wt[l];

                PREFETCH_MATRIX(1,transMatrix,w);

                for(int k = startPattern; k < endPattern; k++) {

                    const REALTYPE* partials1 = partialsChild;

                    PREFETCH_PARTIALS(1,partials1,v);

                    DO_INTEGRATION(1);

                    integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                    integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                    integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                    integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                    u += 4;
                    v += 4;
                }
                w += OFFSET*4;
          #if 0//
                if (kExtraPatterns)
                  v += 4 * kExtraPatterns;
                v += ((kPatternCount - endPattern) + startPattern) * 4;
          #endif//
            }
        }
    }

    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}